

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_function_widget.cpp
# Opt level: O0

void __thiscall tfnw::TransferFunctionWidget::TransferFunctionWidget(TransferFunctionWidget *this)

{
  initializer_list<tfnw::TransferFunctionWidget::vec2f> __l;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  allocator local_179;
  string local_178;
  allocator local_151;
  string local_150;
  allocator local_129;
  string local_128;
  allocator local_101;
  string local_100;
  allocator local_d9;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  allocator local_61;
  string local_60;
  allocator<tfnw::TransferFunctionWidget::vec2f> local_3d [13];
  vec2f local_30;
  vec2f local_28;
  iterator local_20;
  size_type local_18;
  TransferFunctionWidget *local_10;
  TransferFunctionWidget *this_local;
  
  local_10 = this;
  std::vector<tfnw::Colormap,_std::allocator<tfnw::Colormap>_>::vector(&this->colormaps);
  this->selected_colormap = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->current_colormap);
  vec2f::vec2f(&local_30,0.0);
  vec2f::vec2f(&local_28,1.0);
  local_20 = &local_30;
  local_18 = 2;
  std::allocator<tfnw::TransferFunctionWidget::vec2f>::allocator(local_3d);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  vector<tfnw::TransferFunctionWidget::vec2f,_std::allocator<tfnw::TransferFunctionWidget::vec2f>_>
  ::vector(&this->alpha_control_pts,__l,local_3d);
  std::allocator<tfnw::TransferFunctionWidget::vec2f>::~allocator(local_3d);
  this->selected_point = 0xffffffffffffffff;
  this->clicked_on_item = false;
  this->gpu_image_stale = true;
  this->colormap_changed = true;
  this->colormap_img = 0xffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"ParaView Cool Warm",&local_61);
  load_embedded_preset(this,paraview_cool_warm,0x1b3,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"Rainbow",&local_89);
  load_embedded_preset(this,rainbow,0x7f,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"Matplotlib Plasma",&local_b1);
  load_embedded_preset(this,matplotlib_plasma,0x17f,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"Matplotlib Virdis",&local_d9);
  load_embedded_preset(this,matplotlib_virdis,0x17b,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_100,"Samsel Linear Green",&local_101);
  load_embedded_preset(this,samsel_linear_green,0x18b,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"Samsel Linear YGB 1211G",&local_129);
  load_embedded_preset(this,samsel_linear_ygb_1211g,0x1ac,&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"Cool Warm Extended",&local_151);
  load_embedded_preset(this,cool_warm_extended,0x1ea,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"Black Body",&local_179);
  load_embedded_preset(this,blackbody,0x8b,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"Jet",&local_1a1);
  load_embedded_preset(this,jet,0xce,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c8,"Blue Gold",&local_1c9);
  load_embedded_preset(this,blue_gold,0x168,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"Ice Fire",&local_1f1);
  load_embedded_preset(this,ice_fire,0x203,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"nic Edge",&local_219);
  load_embedded_preset(this,nic_edge,0x230,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  update_colormap(this);
  return;
}

Assistant:

TransferFunctionWidget::TransferFunctionWidget()
{
    // Load up the embedded colormaps as the default options
    load_embedded_preset(paraview_cool_warm, sizeof(paraview_cool_warm), "ParaView Cool Warm");
    load_embedded_preset(rainbow, sizeof(rainbow), "Rainbow");
    load_embedded_preset(matplotlib_plasma, sizeof(matplotlib_plasma), "Matplotlib Plasma");
    load_embedded_preset(matplotlib_virdis, sizeof(matplotlib_virdis), "Matplotlib Virdis");
    load_embedded_preset(
        samsel_linear_green, sizeof(samsel_linear_green), "Samsel Linear Green");
    load_embedded_preset(
        samsel_linear_ygb_1211g, sizeof(samsel_linear_ygb_1211g), "Samsel Linear YGB 1211G");
    load_embedded_preset(cool_warm_extended, sizeof(cool_warm_extended), "Cool Warm Extended");
    load_embedded_preset(blackbody, sizeof(blackbody), "Black Body");
    load_embedded_preset(jet, sizeof(jet), "Jet");
    load_embedded_preset(blue_gold, sizeof(blue_gold), "Blue Gold");
    load_embedded_preset(ice_fire, sizeof(ice_fire), "Ice Fire");
    load_embedded_preset(nic_edge, sizeof(nic_edge), "nic Edge");

    // Initialize the colormap alpha channel w/ a linear ramp
    update_colormap();
}